

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O3

uint32_t nexttoken(char **pp,int allowlit,int allowany)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s;
  ulong uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong uVar9;
  char *r;
  char *local_50;
  
  __s = *pp;
  if (__s == (char *)0x0) {
    allowany = 0;
  }
  else {
    pcVar3 = strchr(__s,0x20);
    if (pcVar3 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = pcVar3 + 1;
      *pcVar3 = '\0';
    }
    *pp = pcVar5;
    if (allowlit != 0) {
      iVar2 = strncmp(__s,"IRFPM_",6);
      if (iVar2 == 0) {
        pcVar3 = "FLOOR";
        uVar6 = 0;
        do {
          iVar2 = strcmp(pcVar3,__s + 6);
          if (iVar2 == 0) {
            return (uint32_t)uVar6;
          }
          uVar6 = (ulong)((uint32_t)uVar6 + 1);
          pcVar3 = irfpm_names[uVar6];
        } while (pcVar3 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar2 = strncmp(__s,"IRFL_",5);
      if (iVar2 == 0) {
        pcVar3 = "STR_LEN";
        uVar6 = 0;
        do {
          iVar2 = strcmp(pcVar3,__s + 5);
          if (iVar2 == 0) {
            return (uint32_t)uVar6;
          }
          uVar6 = (ulong)((uint32_t)uVar6 + 1);
          pcVar3 = irfield_names[uVar6];
        } while (pcVar3 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar2 = strncmp(__s,"IRCALL_",7);
      if (iVar2 == 0) {
        pcVar3 = "lj_str_cmp";
        uVar6 = 0;
        do {
          iVar2 = strcmp(pcVar3,__s + 7);
          if (iVar2 == 0) {
            return (uint32_t)uVar6;
          }
          uVar6 = (ulong)((uint32_t)uVar6 + 1);
          pcVar3 = ircall_names[uVar6];
        } while (pcVar3 != (char *)0x0);
        goto LAB_0010c7f5;
      }
      iVar2 = strncmp(__s,"IRCONV_",7);
      if (iVar2 == 0) goto LAB_0010c7fd;
      cVar1 = *__s;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar7 = 0;
        do {
          uVar7 = (uint)(byte)(cVar1 - 0x30) + uVar7 * 10;
          cVar1 = __s[1];
          __s = __s + 1;
        } while ((byte)(cVar1 - 0x30U) < 10);
        if (cVar1 == '\0') {
          return uVar7;
        }
        goto LAB_0010c7f5;
      }
    }
    if ((allowany == 0) || (iVar2 = strcmp("any",__s), iVar2 != 0)) {
      pcVar3 = "LT";
      uVar6 = 0;
      do {
        iVar2 = strcmp(pcVar3,__s);
        if (iVar2 == 0) {
          return (uint32_t)uVar6;
        }
        uVar6 = (ulong)((uint32_t)uVar6 + 1);
        pcVar3 = ir_names[uVar6];
      } while (pcVar3 != (char *)0x0);
LAB_0010c7f5:
      do {
        nexttoken_cold_1();
LAB_0010c7fd:
        pcVar5 = "NIL";
        pcVar3 = __s + 7;
        pcVar4 = strchr(pcVar3,0x5f);
        uVar7 = 0;
        local_50 = "NIL";
        uVar6 = 0;
        do {
          if ((pcVar4 != (char *)0x0) &&
             (iVar2 = strncmp(pcVar5,pcVar3,(long)pcVar4 - (long)pcVar3), iVar2 == 0)) {
            uVar9 = 1;
            pcVar5 = local_50;
            uVar8 = uVar7;
            do {
              iVar2 = strcmp(pcVar5,pcVar4 + 1);
              if (iVar2 == 0) {
                return uVar8;
              }
              pcVar5 = irt_names[uVar9];
              uVar8 = uVar8 + 1;
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (pcVar5 != (char *)0x0);
          }
          uVar6 = (ulong)((int)uVar6 + 1);
          pcVar5 = irt_names[uVar6];
          uVar7 = uVar7 + 0x20;
        } while (pcVar5 != (char *)0x0);
      } while( true );
    }
  }
  return allowany;
}

Assistant:

static uint32_t nexttoken(char **pp, int allowlit, int allowany)
{
  char *p = *pp;
  if (p) {
    uint32_t i;
    char *q = strchr(p, ' ');
    if (q) *q++ = '\0';
    *pp = q;
    if (allowlit && !strncmp(p, "IRFPM_", 6)) {
      for (i = 0; irfpm_names[i]; i++)
	if (!strcmp(irfpm_names[i], p+6))
	  return i;
    } else if (allowlit && !strncmp(p, "IRFL_", 5)) {
      for (i = 0; irfield_names[i]; i++)
	if (!strcmp(irfield_names[i], p+5))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCALL_", 7)) {
      for (i = 0; ircall_names[i]; i++)
	if (!strcmp(ircall_names[i], p+7))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCONV_", 7)) {
      for (i = 0; irt_names[i]; i++) {
	const char *r = strchr(p+7, '_');
	if (r && !strncmp(irt_names[i], p+7, r-(p+7))) {
	  uint32_t j;
	  for (j = 0; irt_names[j]; j++)
	    if (!strcmp(irt_names[j], r+1))
	      return (i << 5) + j;
	}
      }
    } else if (allowlit && *p >= '0' && *p <= '9') {
      for (i = 0; *p >= '0' && *p <= '9'; p++)
	i = i*10 + (*p - '0');
      if (*p == '\0')
	return i;
    } else if (allowany && !strcmp("any", p)) {
      return allowany;
    } else {
      for (i = 0; ir_names[i]; i++)
	if (!strcmp(ir_names[i], p))
	  return i;
    }
    fprintf(stderr, "Error: bad fold definition token \"%s\" at line %d\n", p, lineno);
    exit(1);
  }
  return 0;
}